

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O3

void Sfm_NtkRemoveFanin(Sfm_Ntk_t *p,int iNode,int iFanin)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  
  if (p->nPis <= iNode) {
    if (p->nPos + iNode < p->nObjs) {
      if (p->nObjs <= p->nPos + iFanin) {
        __assert_fail("!Sfm_ObjIsPo(p, iFanin)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                      ,0x10b,"void Sfm_NtkRemoveFanin(Sfm_Ntk_t *, int, int)");
      }
      if ((iNode < 0) || ((p->vFanins).nSize <= iNode)) {
LAB_00539d46:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar1 = (p->vFanins).pArray;
      iVar3 = pVVar1[(uint)iNode].nSize;
      if ((long)iVar3 < 1) {
        if (iVar3 != 0) {
LAB_00539db5:
          __assert_fail("i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
        }
      }
      else {
        piVar2 = pVVar1[(uint)iNode].pArray;
        lVar4 = 1;
        do {
          if (piVar2[lVar4 + -1] == iFanin) {
            if ((int)lVar4 < iVar3) {
              do {
                piVar2[lVar4 + -1] = piVar2[lVar4];
                lVar4 = lVar4 + 1;
                iVar3 = pVVar1[(uint)iNode].nSize;
              } while ((int)lVar4 < iVar3);
            }
            pVVar1[(uint)iNode].nSize = iVar3 + -1;
            if ((iFanin < 0) || ((p->vFanouts).nSize <= iFanin)) goto LAB_00539d46;
            pVVar1 = (p->vFanouts).pArray;
            iVar3 = pVVar1[(uint)iFanin].nSize;
            if (0 < (long)iVar3) {
              piVar2 = pVVar1[(uint)iFanin].pArray;
              lVar4 = 1;
              do {
                if (piVar2[lVar4 + -1] == iNode) {
                  if ((int)lVar4 < iVar3) {
                    do {
                      piVar2[lVar4 + -1] = piVar2[lVar4];
                      lVar4 = lVar4 + 1;
                      iVar3 = pVVar1[(uint)iFanin].nSize;
                    } while ((int)lVar4 < iVar3);
                  }
                  pVVar1[(uint)iFanin].nSize = iVar3 + -1;
                  return;
                }
                bVar5 = lVar4 != iVar3;
                lVar4 = lVar4 + 1;
              } while (bVar5);
LAB_00539d0b:
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                            ,0x10f,"void Sfm_NtkRemoveFanin(Sfm_Ntk_t *, int, int)");
            }
            if (iVar3 == 0) goto LAB_00539d0b;
            goto LAB_00539db5;
          }
          bVar5 = lVar4 != iVar3;
          lVar4 = lVar4 + 1;
        } while (bVar5);
      }
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                    ,0x10d,"void Sfm_NtkRemoveFanin(Sfm_Ntk_t *, int, int)");
    }
  }
  __assert_fail("Sfm_ObjIsNode(p, iNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                ,0x10a,"void Sfm_NtkRemoveFanin(Sfm_Ntk_t *, int, int)");
}

Assistant:

void Sfm_NtkRemoveFanin( Sfm_Ntk_t * p, int iNode, int iFanin )
{
    int RetValue;
    assert( Sfm_ObjIsNode(p, iNode) );
    assert( !Sfm_ObjIsPo(p, iFanin) );
    RetValue = Vec_IntRemove( Sfm_ObjFiArray(p, iNode), iFanin );
    assert( RetValue );
    RetValue = Vec_IntRemove( Sfm_ObjFoArray(p, iFanin), iNode );
    assert( RetValue );
}